

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
hdc::Graph<int>::coloring
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,Graph<int> *this,int n_colors)

{
  _Rb_tree_color _Var1;
  int iVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  _Elt_pointer piVar5;
  _Elt_pointer psVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_color *p_Var10;
  ostream *poVar11;
  int local_228;
  int node;
  Graph<int> *local_220;
  _Rb_tree_node_base *local_218;
  set<int,_std::less<int>,_std::allocator<int>_> availableColors;
  stack<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  st_edges;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  set<int,_std::less<int>,_std::allocator<int>_> colorsPool;
  set<int,_std::less<int>,_std::allocator<int>_> removed;
  string local_e0;
  Graph<int> aux;
  
  local_218 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_218;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_218;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  Graph(&aux,this);
  removed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &removed._M_t._M_impl.super__Rb_tree_header._M_header;
  removed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  removed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  removed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  removed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       removed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&st);
  local_220 = this;
  std::
  stack<std::set<int,std::less<int>,std::allocator<int>>,std::deque<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
  ::
  stack<std::deque<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,void>
            (&st_edges);
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &colorsPool._M_t._M_impl.super__Rb_tree_header._M_header;
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  colorsPool._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       colorsPool._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (availableColors._M_t._M_impl._0_4_ = 0; (int)availableColors._M_t._M_impl._0_4_ < n_colors;
      availableColors._M_t._M_impl._0_4_ = availableColors._M_t._M_impl._0_4_ + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &colorsPool,(int *)&availableColors);
  }
  do {
    p_Var3 = aux.graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var3 == &aux.graph._M_t._M_impl.super__Rb_tree_header) {
        if (aux.graph._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          to_str_abi_cxx11_((string *)&availableColors,&aux);
          std::operator<<((ostream *)&std::cout,(string *)&availableColors);
          std::__cxx11::string::~string((string *)&availableColors);
          local_228 = -1;
          while( true ) {
            sVar4 = std::deque<int,_std::allocator<int>_>::size(&st.c);
            if (sVar4 == 0) break;
            piVar5 = st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur ==
                st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_first) {
              piVar5 = st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            node = piVar5[-1];
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&availableColors,&colorsPool._M_t);
            insertNode(&aux,node);
            psVar6 = st_edges.c.
                     super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (st_edges.c.
                super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                st_edges.c.
                super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar6 = st_edges.c.
                       super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
            }
            p_Var9 = psVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while( true ) {
              psVar6 = st_edges.c.
                       super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (st_edges.c.
                  super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  st_edges.c.
                  super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar6 = st_edges.c.
                         super__Deque_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
              }
              if ((_Rb_tree_header *)p_Var9 == &psVar6[-1]._M_t._M_impl.super__Rb_tree_header)
              break;
              makeEdge(&aux,node,p_Var9[1]._M_color);
              sVar7 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      count(__return_storage_ptr__,(key_type *)(p_Var9 + 1));
              if (sVar7 != 0) {
                pmVar8 = std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::operator[](__return_storage_ptr__,(key_type *)(p_Var9 + 1));
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                erase((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&availableColors,pmVar8);
              }
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            }
            _Var1 = availableColors._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color
            ;
            p_Var10 = (_Rb_tree_color *)
                      std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](__return_storage_ptr__,&node);
            *p_Var10 = _Var1;
            pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](__return_storage_ptr__,&node);
            if (local_228 < *pmVar8) {
              pmVar8 = std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[](__return_storage_ptr__,&node);
              local_228 = *pmVar8;
            }
            to_str_abi_cxx11_(&local_e0,&aux);
            std::operator<<((ostream *)&std::cout,(string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::deque<int,_std::allocator<int>_>::pop_back(&st.c);
            std::
            deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::pop_back(&st_edges.c);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&availableColors);
          }
          for (p_Var3 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header.
                        _M_left; p_Var3 != local_218;
              p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_Var3[1]._M_color);
            poVar11 = std::operator<<(poVar11,": ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(int *)&p_Var3[1].field_0x4);
            std::operator<<(poVar11,'\n');
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::operator=(&(local_220->assignedColors)._M_t,&__return_storage_ptr__->_M_t);
          poVar11 = std::operator<<((ostream *)&std::cout,"#colors = ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_228 + 1);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&colorsPool._M_t);
          std::
          deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::~deque(&st_edges.c);
          std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                    ((_Deque_base<int,_std::allocator<int>_> *)&st);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&removed._M_t);
          ~Graph(&aux);
          return __return_storage_ptr__;
        }
        std::operator<<((ostream *)&std::cout,"Graph coloring: couldn\'t colore graph\nExiting...\n"
                       );
        exit(0);
      }
      iVar2 = countEdges(&aux,p_Var3[1]._M_color);
      if (iVar2 < n_colors) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    }
    to_str_abi_cxx11_((string *)&availableColors,&aux);
    std::operator<<((ostream *)&std::cout,(string *)&availableColors);
    p_Var9 = p_Var3 + 1;
    std::__cxx11::string::~string((string *)&availableColors);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&removed,
               (int *)p_Var9);
    std::deque<int,_std::allocator<int>_>::push_back(&st.c,(value_type_conflict *)p_Var9);
    std::
    deque<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::push_back(&st_edges.c,(value_type *)&p_Var3[1]._M_parent);
    removeNode(&aux,p_Var9->_M_color);
  } while( true );
}

Assistant:

std::map<T, int> coloring(int n_colors) {
            std::map<T, int> r;
            Graph<T> aux = *this;
            std::set<T> removed;
            std::stack<T> st;
            std::stack<std::set<T> > st_edges;
            bool foundVertex = true;
            std::set<int> colorsPool;
            int max_color = -1;

            typename std::map<T, std::set<T> >::iterator it1;

            for (int i = 0; i < n_colors; ++i) {
                colorsPool.insert(i);
            }

            while (foundVertex) {
                foundVertex = false;

                for (it1 = aux.graph.begin(); it1 != aux.graph.end(); ++it1) {
                    if (aux.countEdges(it1->first) < n_colors) {
                        std::cout << aux.to_str();

                        removed.insert(it1->first);
                        st.push(it1->first);
                        st_edges.push(it1->second);
                        foundVertex = true;
                        aux.removeNode(it1->first);
                        break;
                    }
                }
            }

            if (aux.graph.size() != 0) {
                std::cout << "Graph coloring: couldn't colore graph\nExiting...\n";
                exit(0);
            }

            std::cout << aux.to_str();

            while (st.size() > 0) {
                T node = st.top();
                std::set<int> availableColors = colorsPool;
                typename std::set<T>::iterator it;

                aux.insertNode(node);

                for (it = st_edges.top().begin(); it != st_edges.top().end(); ++it) {
                    aux.makeEdge(node, *it);

                    if (r.count(*it) > 0) {
                        availableColors.erase(r[*it]);
                    }
                }

                r[node] = *availableColors.begin();

                if (r[node] > max_color) {
                    max_color = r[node];
                }

                std::cout << aux.to_str();
                st.pop();
                st_edges.pop();
            }

            typename std::map<T, int>::iterator j;

            for (j = r.begin(); j != r.end(); ++j) {
                std::cout << j->first << ": " << j->second << '\n';
            }

            assignedColors = r;
            std::cout << "#colors = " << (max_color + 1) << std::endl;
            return r;
        }